

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestCamelCaseFieldNames::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  string_view value;
  string_view value_00;
  uint uVar1;
  TestCamelCaseFieldNames *pTVar2;
  string *value_01;
  TestCamelCaseFieldNames **v1;
  TestCamelCaseFieldNames **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  RepeatedField<int> *pRVar4;
  RepeatedField<int> *pRVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar7;
  RepeatedPtrField<edition_unittest::ForeignMessage> *this;
  RepeatedPtrField<edition_unittest::ForeignMessage> *other;
  uint32_t *puVar8;
  Arena *pAVar9;
  ForeignMessage *pFVar10;
  LogMessage local_128;
  Voidify local_111;
  string_view local_110;
  string_view local_100;
  uint local_f0;
  uint32_t cached_has_bits;
  LogMessage local_e0;
  Voidify local_c9;
  TestCamelCaseFieldNames *local_c8;
  Nullable<const_char_*> local_c0;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestCamelCaseFieldNames *from;
  TestCamelCaseFieldNames *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_88;
  size_t local_80;
  char *local_78;
  TestCamelCaseFieldNames *local_70;
  size_t local_68;
  char *local_60;
  anon_union_192_1_493b367e_for_TestCamelCaseFieldNames_3 *local_58;
  size_t local_50;
  char *local_48;
  TestCamelCaseFieldNames *local_40;
  size_t local_38;
  char *local_30;
  anon_union_192_1_493b367e_for_TestCamelCaseFieldNames_3 *local_28;
  string *local_20;
  TestCamelCaseFieldNames *local_18;
  anon_union_192_1_493b367e_for_TestCamelCaseFieldNames_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (TestCamelCaseFieldNames *)to_msg;
  _this = (TestCamelCaseFieldNames *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_c8 = (TestCamelCaseFieldNames *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestCamelCaseFieldNames_const*>(&local_c8);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestCamelCaseFieldNames*>(&from);
  local_c0 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestCamelCaseFieldNames_const*,edition_unittest::TestCamelCaseFieldNames*>
                       (v1,v2,"&from != _this");
  if (local_c0 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_c0);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x69fb,failure_msg);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_c9,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_e0);
  }
  local_f0 = 0;
  pRVar4 = _internal_mutable_repeatedprimitivefield(from);
  pRVar5 = _internal_repeatedprimitivefield((TestCamelCaseFieldNames *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar4,pRVar5);
  pRVar6 = _internal_mutable_repeatedstringfield_abi_cxx11_(from);
  pRVar7 = _internal_repeatedstringfield_abi_cxx11_((TestCamelCaseFieldNames *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar6,pRVar7);
  pRVar4 = _internal_mutable_repeatedenumfield(from);
  pRVar5 = _internal_repeatedenumfield((TestCamelCaseFieldNames *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar4,pRVar5);
  this = _internal_mutable_repeatedmessagefield(from);
  other = _internal_repeatedmessagefield((TestCamelCaseFieldNames *)arena);
  google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::MergeFrom(this,other);
  pRVar6 = _internal_mutable_repeatedstringpiecefield_abi_cxx11_(from);
  pRVar7 = _internal_repeatedstringpiecefield_abi_cxx11_((TestCamelCaseFieldNames *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar6,pRVar7);
  pRVar6 = _internal_mutable_repeatedcordfield_abi_cxx11_(from);
  pRVar7 = _internal_repeatedcordfield_abi_cxx11_((TestCamelCaseFieldNames *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar6,pRVar7);
  puVar8 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  pTVar2 = from;
  local_f0 = *puVar8;
  if ((local_f0 & 0x3f) != 0) {
    if ((local_f0 & 1) != 0) {
      local_100 = _internal_stringfield((TestCamelCaseFieldNames *)arena);
      local_68 = local_100._M_len;
      local_60 = local_100._M_str;
      local_70 = pTVar2;
      local_58 = &pTVar2->field_0;
      puVar8 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      *puVar8 = *puVar8 | 1;
      local_80 = local_68;
      local_78 = local_60;
      pAVar9 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      value._M_str = local_78;
      value._M_len = local_80;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pTVar2->field_0)._impl_.stringfield_,value,pAVar9);
    }
    pTVar2 = from;
    if ((local_f0 & 2) != 0) {
      local_110 = _internal_stringpiecefield((TestCamelCaseFieldNames *)arena);
      local_38 = local_110._M_len;
      local_30 = local_110._M_str;
      local_40 = pTVar2;
      local_28 = &pTVar2->field_0;
      puVar8 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      *puVar8 = *puVar8 | 2;
      local_50 = local_38;
      local_48 = local_30;
      pAVar9 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      value_00._M_str = local_48;
      value_00._M_len = local_50;
      google::protobuf::internal::ArenaStringPtr::Set
                (&(pTVar2->field_0)._impl_.stringpiecefield_,value_00,pAVar9);
    }
    pTVar2 = from;
    if ((local_f0 & 4) != 0) {
      local_20 = _internal_cordfield_abi_cxx11_((TestCamelCaseFieldNames *)arena);
      local_18 = pTVar2;
      local_10 = &pTVar2->field_0;
      puVar8 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      value_01 = local_20;
      *puVar8 = *puVar8 | 4;
      pAVar9 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.cordfield_,value_01,pAVar9);
    }
    if ((local_f0 & 8) != 0) {
      if (arena[1].impl_.mutex_.mu_.super___atomic_base<long>._M_i == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_128,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x6a12,"from._impl_.messagefield_ != nullptr");
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_128);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_111,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_128);
      }
      if ((from->field_0)._impl_.messagefield_ == (ForeignMessage *)0x0) {
        to_msg_local = (MessageLite *)arena[1].impl_.mutex_.mu_.super___atomic_base<long>._M_i;
        local_88 = absl_log_internal_check_op_result;
        pFVar10 = (ForeignMessage *)
                  google::protobuf::Arena::CopyConstruct<edition_unittest::ForeignMessage>
                            ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.messagefield_ = pFVar10;
      }
      else {
        edition_unittest::ForeignMessage::MergeFrom
                  ((from->field_0)._impl_.messagefield_,
                   (ForeignMessage *)arena[1].impl_.mutex_.mu_.super___atomic_base<long>._M_i);
      }
    }
    if ((local_f0 & 0x10) != 0) {
      (from->field_0)._impl_.primitivefield_ = *(int32_t *)&arena[1].impl_.head_._M_b._M_p;
    }
    if ((local_f0 & 0x20) != 0) {
      (from->field_0)._impl_.enumfield_ = *(int *)((long)&arena[1].impl_.head_._M_b._M_p + 4);
    }
  }
  uVar1 = local_f0;
  puVar8 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar8 = uVar1 | *puVar8;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestCamelCaseFieldNames::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestCamelCaseFieldNames*>(&to_msg);
  auto& from = static_cast<const TestCamelCaseFieldNames&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestCamelCaseFieldNames)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeatedprimitivefield()->MergeFrom(from._internal_repeatedprimitivefield());
  _this->_internal_mutable_repeatedstringfield()->MergeFrom(from._internal_repeatedstringfield());
  _this->_internal_mutable_repeatedenumfield()->MergeFrom(from._internal_repeatedenumfield());
  _this->_internal_mutable_repeatedmessagefield()->MergeFrom(
      from._internal_repeatedmessagefield());
  _this->_internal_mutable_repeatedstringpiecefield()->MergeFrom(from._internal_repeatedstringpiecefield());
  _this->_internal_mutable_repeatedcordfield()->MergeFrom(from._internal_repeatedcordfield());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_stringfield(from._internal_stringfield());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_stringpiecefield(from._internal_stringpiecefield());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_cordfield(from._internal_cordfield());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.messagefield_ != nullptr);
      if (_this->_impl_.messagefield_ == nullptr) {
        _this->_impl_.messagefield_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.messagefield_);
      } else {
        _this->_impl_.messagefield_->MergeFrom(*from._impl_.messagefield_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.primitivefield_ = from._impl_.primitivefield_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.enumfield_ = from._impl_.enumfield_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}